

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::MultiThreadedObjectTest::destroyObjects(MultiThreadedObjectTest *this,TestThread *thread)

{
  long *plVar1;
  deUint32 dVar2;
  Library *pLVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  EndMessageToken *pEVar7;
  ThreadLog *pTVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  pLVar3 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx);
  bVar13 = thread->m_id == 0;
  lVar12 = 0x1b8;
  if (bVar13) {
    lVar12 = 0x1a0;
  }
  lVar6 = 0x170;
  if (bVar13) {
    lVar6 = 0x158;
  }
  lVar4 = 0x128;
  if (bVar13) {
    lVar4 = 0x110;
  }
  lVar5 = 0x200;
  if (bVar13) {
    lVar5 = 0x1e8;
  }
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar12);
  lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx + lVar12);
  if (0 < (int)((ulong)(lVar10 - lVar11) >> 3)) {
    pTVar8 = &thread->m_log;
    lVar9 = 0;
    do {
      if (*(long *)(lVar11 + lVar9 * 8) != 0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8," = eglDestroySurface(",0x15);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar8);
        pEVar7 = (EndMessageToken *)0x1b21de7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar7);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"eglDestroySurface()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5aa);
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar12) + lVar9 * 8) = 0;
      }
      lVar9 = lVar9 + 1;
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar12);
      lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar12);
    } while (lVar9 < (int)((ulong)(lVar10 - lVar11) >> 3));
  }
  if (lVar10 != lVar11) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar12) = lVar11;
  }
  lVar12 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar6);
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx + lVar6);
  if (0 < (int)((ulong)(lVar11 - lVar12) >> 4)) {
    pTVar8 = &thread->m_log;
    lVar9 = 0;
    lVar10 = 0;
    do {
      if (*(long *)(lVar12 + 8 + lVar9) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8,"eglDestroySurface(",0x12);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar8);
        pEVar7 = (EndMessageToken *)0x1b21de7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar7);
        (*pLVar3->_vptr_Library[0x16])
                  (pLVar3,(this->super_MultiThreadedTest).m_display,
                   *(undefined8 *)
                    (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                      super_TestNode._vptr_TestNode + lVar6) + 8 + lVar9));
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, windows[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5b5);
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar6) + 8 + lVar9) = 0;
      }
      plVar1 = *(long **)(*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.
                                           super_TestCase.super_TestNode._vptr_TestNode + lVar6) +
                         lVar9);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar6) + lVar9) = 0;
      }
      lVar10 = lVar10 + 1;
      lVar12 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar6);
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar6);
      lVar9 = lVar9 + 0x10;
    } while (lVar10 < (int)((ulong)(lVar11 - lVar12) >> 4));
  }
  if (lVar11 != lVar12) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar6) = lVar12;
  }
  lVar12 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar4);
  lVar6 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx + lVar4);
  if (0 < (int)((ulong)(lVar6 - lVar12) >> 4)) {
    pTVar8 = &thread->m_log;
    lVar10 = 0;
    lVar11 = 0;
    do {
      if (*(long *)(lVar12 + lVar10) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8,"eglDestroySurface(",0x12);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar8);
        pEVar7 = (EndMessageToken *)0x1b21de7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar7);
        (*pLVar3->_vptr_Library[0x16])
                  (pLVar3,(this->super_MultiThreadedTest).m_display,
                   *(undefined8 *)
                    (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                      super_TestNode._vptr_TestNode + lVar4) + 8 + lVar10));
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, pixmaps[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5c6);
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar4) + 8 + lVar10) = 0;
      }
      plVar1 = *(long **)(*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.
                                           super_TestCase.super_TestNode._vptr_TestNode + lVar4) +
                         lVar10);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar4) + lVar10) = 0;
      }
      lVar11 = lVar11 + 1;
      lVar12 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar4);
      lVar6 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx + lVar4);
      lVar10 = lVar10 + 0x10;
    } while (lVar11 < (int)((ulong)(lVar6 - lVar12) >> 4));
  }
  if (lVar6 != lVar12) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar4) = lVar12;
  }
  lVar12 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar5);
  lVar6 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx + lVar5);
  if (0 < (int)((ulong)(lVar6 - lVar12) >> 3)) {
    pTVar8 = &thread->m_log;
    lVar4 = 0;
    do {
      if (*(long *)(lVar12 + lVar4 * 8) != 0) {
        (*pLVar3->_vptr_Library[0x13])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroyContext(m_display, contexts[contextNdx])",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5d6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8,"eglDestroyContext(",0x12);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar8);
        pEVar7 = (EndMessageToken *)0x1b21de7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar7);
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar5) + lVar4 * 8) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar12 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar5);
      lVar6 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx + lVar5);
    } while (lVar4 < (int)((ulong)(lVar6 - lVar12) >> 3));
  }
  if (lVar6 != lVar12) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar5) = lVar12;
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::destroyObjects (TestThread& thread)
{
	const Library&										egl			= getLibrary();
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < (int)pbuffers.size(); pbufferNdx++)
	{
		if (pbuffers[pbufferNdx] != EGL_NO_SURFACE)
		{
			// Destroy EGLSurface
			EGLBoolean result;

			result = egl.destroySurface(m_display, pbuffers[pbufferNdx]);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglDestroySurface(" << m_display << ", " << pbuffers[pbufferNdx] << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			pbuffers[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	pbuffers.clear();

	for (int windowNdx = 0; windowNdx < (int)windows.size(); windowNdx++)
	{
		if (windows[windowNdx].second != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << windows[windowNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, windows[windowNdx].second));
			windows[windowNdx].second = EGL_NO_SURFACE;
		}

		if (windows[windowNdx].first)
		{
			delete windows[windowNdx].first;
			windows[windowNdx].first = NULL;
		}
	}
	windows.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)pixmaps.size(); pixmapNdx++)
	{
		if (pixmaps[pixmapNdx].first != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << pixmaps[pixmapNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, pixmaps[pixmapNdx].second));
			pixmaps[pixmapNdx].second = EGL_NO_SURFACE;
		}

		if (pixmaps[pixmapNdx].first)
		{
			delete pixmaps[pixmapNdx].first;
			pixmaps[pixmapNdx].first = NULL;
		}
	}
	pixmaps.clear();

	for (int contextNdx = 0; contextNdx < (int)contexts.size(); contextNdx++)
	{
		if (contexts[contextNdx] != EGL_NO_CONTEXT)
		{
			EGLU_CHECK_CALL(egl, destroyContext(m_display, contexts[contextNdx]));
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroyContext(" << m_display << ", " << contexts[contextNdx]  << ")" << ThreadLog::EndMessage;
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}
	}
	contexts.clear();
}